

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::exception(string *message)

{
  ostream *this;
  runtime_error *this_00;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string local_28 [40];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffb8;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,in_stack_ffffffffffffff90);
  std::__cxx11::string::operator=(in_RDI,local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  if (0 < options::verbosity) {
    this = std::operator<<((ostream *)&std::cout,in_RDI);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,in_RDI);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void exception(std::string message) {

  message = options::printPrefix + " [EXCEPTION] " + message;

  if (options::verbosity > 0) {
    std::cout << message << std::endl;
  }

  throw std::runtime_error(message);
}